

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O1

void downsampleBy2(int16_t *in,size_t len,int16_t *out,int32_t *filtState)

{
  int iVar1;
  int16_t iVar2;
  int iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  ulong uVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t iVar13;
  int32_t iVar14;
  int32_t iVar15;
  int iVar16;
  
  iVar5 = *filtState;
  iVar15 = filtState[1];
  iVar13 = filtState[2];
  iVar9 = filtState[3];
  iVar14 = filtState[4];
  iVar16 = filtState[5];
  iVar6 = filtState[6];
  iVar1 = filtState[7];
  if (1 < len) {
    uVar10 = 0;
    iVar7 = iVar5;
    iVar12 = iVar15;
    iVar11 = iVar13;
    iVar3 = iVar16;
    iVar4 = iVar6;
    iVar8 = iVar14;
    do {
      iVar5 = in[uVar10 * 2] * 0x400;
      iVar15 = ((iVar5 - iVar12 & 0xffffU) * 0x2fa7 >> 0x10) +
               (iVar5 - iVar12 >> 0x10) * 0x2fa7 + iVar7;
      iVar13 = ((iVar15 - iVar11 & 0xffffU) * 0x925f >> 0x10) +
               (iVar15 - iVar11 >> 0x10) * 0x925f + iVar12;
      iVar9 = ((iVar13 - iVar9 & 0xffffU) * 0xeb5f >> 0x10) +
              (iVar13 - iVar9 >> 0x10) * 0xeb5f + iVar11;
      iVar14 = in[uVar10 * 2 + 1] * 0x400;
      iVar16 = ((iVar14 - iVar3 & 0xffffU) * 0xcd4 >> 0x10) +
               (iVar14 - iVar3 >> 0x10) * 0xcd4 + iVar8;
      iVar6 = ((iVar16 - iVar4 & 0xffffU) * 0x5f79 >> 0x10) +
              (iVar16 - iVar4 >> 0x10) * 0x5f79 + iVar3;
      iVar1 = ((iVar6 - iVar1 & 0xffffU) * 0xc178 >> 0x10) +
              (iVar6 - iVar1 >> 0x10) * 0xc178 + iVar4;
      iVar3 = iVar9 + iVar1 + 0x400 >> 0xb;
      iVar2 = (int16_t)iVar3;
      if (iVar3 < -0x7fff) {
        iVar2 = -0x8000;
      }
      out[uVar10] = iVar2;
      uVar10 = uVar10 + 1;
      iVar7 = iVar5;
      iVar12 = iVar15;
      iVar11 = iVar13;
      iVar3 = iVar16;
      iVar4 = iVar6;
      iVar8 = iVar14;
    } while (len >> 1 != uVar10);
  }
  *filtState = iVar5;
  filtState[1] = iVar15;
  filtState[2] = iVar13;
  filtState[3] = iVar9;
  filtState[4] = iVar14;
  filtState[5] = iVar16;
  filtState[6] = iVar6;
  filtState[7] = iVar1;
  return;
}

Assistant:

static __inline void downsampleBy2(const int16_t *in, size_t len, int16_t *out, int32_t *filtState) {
    int32_t tmp1, tmp2, diff, in32, out32;
    size_t i;

    register int32_t state0 = filtState[0];
    register int32_t state1 = filtState[1];
    register int32_t state2 = filtState[2];
    register int32_t state3 = filtState[3];
    register int32_t state4 = filtState[4];
    register int32_t state5 = filtState[5];
    register int32_t state6 = filtState[6];
    register int32_t state7 = filtState[7];

    for (i = (len >> 1); i > 0; i--) {
        // lower allpass filter
        in32 = (int32_t) (*in++) * (1 << 10);
        diff = in32 - state1;
        tmp1 = ((state0) + ((diff) >> 16) * (kResampleAllpass2[0]) +
                (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass2[0])) >> 16));
        state0 = in32;
        diff = tmp1 - state2;
        tmp2 = ((state1) + ((diff) >> 16) * (kResampleAllpass2[1]) +
                (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass2[1])) >> 16));
        state1 = tmp1;
        diff = tmp2 - state3;
        state3 = ((state2) + ((diff) >> 16) * (kResampleAllpass2[2]) +
                  (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass2[2])) >> 16));
        state2 = tmp2;

        // upper allpass filter
        in32 = (int32_t) (*in++) * (1 << 10);
        diff = in32 - state5;
        tmp1 = ((state4) + ((diff) >> 16) * (kResampleAllpass1[0]) +
                (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass1[0])) >> 16));

        state4 = in32;
        diff = tmp1 - state6;
        tmp2 = ((state5) + ((diff) >> 16) * (kResampleAllpass1[1]) +
                (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass1[1])) >> 16));

        state5 = tmp1;
        diff = tmp2 - state7;
        state7 = ((state6) + ((diff) >> 16) * (kResampleAllpass1[2]) +
                  (((uint32_t)((diff) & 0x0000FFFF) * (kResampleAllpass1[2])) >> 16));

        state6 = tmp2;

        // add two allpass outputs, divide by two and round
        out32 = (state3 + state7 + 1024) >> 11;

        // limit amplitude to prevent wrap-around, and write to output array
        *out++ = SatW32ToW16(out32);
    }

    filtState[0] = state0;
    filtState[1] = state1;
    filtState[2] = state2;
    filtState[3] = state3;
    filtState[4] = state4;
    filtState[5] = state5;
    filtState[6] = state6;
    filtState[7] = state7;
}